

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_GiveInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *receiver;
  PClass *pPVar1;
  int iVar2;
  TArray<VMValue,_VMValue> *in_RAX;
  undefined4 extraout_var;
  PClass *pPVar3;
  int iVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  iVar2 = (int)in_RAX;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      receiver = (AActor *)(param->field_0).field_1.a;
      if (receiver != (AActor *)0x0) {
        if ((receiver->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(receiver->super_DThinker).super_DObject._vptr_DObject)(receiver);
          (receiver->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
          in_RAX = defaultparam;
        }
        iVar2 = (int)in_RAX;
        pPVar3 = (receiver->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ceeb4;
        }
      }
      iVar4 = 0;
      bVar5 = DoGiveInventory(receiver,false,param,defaultparam,numparam,(VMReturn *)defaultparam,
                              iVar2);
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x97b,
                        "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(uint *)ret->Location = (uint)bVar5;
        iVar4 = 1;
      }
      return iVar4;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003ceeb4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x97a,
                "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(DoGiveInventory(self, false, VM_ARGS_NAMES));
}